

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O0

Float __thiscall pbrt::LightBounds::Importance(LightBounds *this,Point3f p,Normal3f n)

{
  bool bVar1;
  float *pfVar2;
  Point3<float> *in_RDI;
  Point3<float> *v;
  type tVar3;
  float fVar4;
  float sinThetaB;
  type cosThetaA;
  float fVar5;
  Float FVar6;
  undefined1 in_ZMM0 [64];
  undefined1 auVar11 [56];
  undefined1 auVar7 [64];
  undefined1 extraout_var [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 in_ZMM2 [64];
  Point3f PVar12;
  Vector3<float> VVar13;
  Float cosThetap_i;
  Float sinTheta_i;
  Float cosTheta_i;
  Float imp;
  Float cosTheta_p;
  Float sinTheta_x;
  Float cosTheta_x;
  Float sinTheta_u;
  Float cosTheta_u;
  anon_class_1_0_00000001 sinSubClamped;
  anon_class_1_0_00000001 cosSubClamped;
  Float sinTheta;
  Float cosTheta;
  Vector3f wi;
  Float d2;
  Point3f pc;
  float sinThetaA;
  float sinThetaA_00;
  Tuple3<pbrt::Point3,_float> *p_00;
  Bounds3<float> *this_00;
  undefined4 in_stack_fffffffffffffee0;
  float in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffef0;
  float in_stack_fffffffffffffef4;
  float local_100;
  Float local_fc;
  Float local_f8;
  Float local_f4;
  float local_f0;
  Point3f *in_stack_ffffffffffffff18;
  Float in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  anon_class_1_0_00000001 local_d2;
  anon_class_1_0_00000001 local_d1;
  float local_d0;
  float local_cc;
  Tuple3<pbrt::Vector3,_float> local_c8;
  undefined8 local_b8;
  float local_b0;
  undefined8 local_a8;
  float local_a0;
  Tuple3<pbrt::Vector3,_float> local_9c;
  undefined8 local_90;
  float local_88;
  undefined8 local_80;
  float local_78;
  float local_70;
  float local_6c;
  Tuple3<pbrt::Point3,_float> local_68;
  Bounds3<float> local_58;
  Tuple3<pbrt::Normal3,_float> local_40;
  Tuple3<pbrt::Normal3,_float> local_30;
  Tuple3<pbrt::Point3,_float> local_20;
  Tuple3<pbrt::Point3,_float> local_10;
  float local_4;
  
  auVar11 = in_ZMM0._8_56_;
  local_20._0_8_ = vmovlpd_avx(in_ZMM0._0_16_);
  local_40._0_8_ = vmovlpd_avx(in_ZMM2._0_16_);
  local_30._0_8_ = local_40._0_8_;
  local_10._0_8_ = local_20._0_8_;
  PVar12 = Centroid((LightBounds *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  local_68.z = PVar12.super_Tuple3<pbrt::Point3,_float>.z;
  auVar7._0_8_ = PVar12.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar7._8_56_ = auVar11;
  local_68._0_8_ = vmovlpd_avx(auVar7._0_16_);
  p_00 = &local_10;
  this_00 = &local_58;
  local_58.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ = local_68._0_8_;
  local_58.pMin.super_Tuple3<pbrt::Point3,_float>.z = local_68.z;
  local_6c = DistanceSquared<float>
                       ((Point3<float> *)
                        CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),in_RDI);
  auVar11 = extraout_var;
  VVar13 = Bounds3<float>::Diagonal(this_00);
  local_88 = VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar8._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar8._8_56_ = auVar11;
  local_90 = vmovlpd_avx(auVar8._0_16_);
  local_80 = local_90;
  local_78 = local_88;
  tVar3 = Length<float>((Vector3<float> *)0x7f2820);
  local_70 = tVar3 * 0.5;
  pfVar2 = std::max<float>(&local_6c,&local_70);
  local_6c = *pfVar2;
  auVar11 = (undefined1  [56])0x0;
  VVar13 = Point3<float>::operator-(&this_00->pMin,(Point3<float> *)p_00);
  local_b0 = VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar9._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar9._8_56_ = auVar11;
  local_b8 = vmovlpd_avx(auVar9._0_16_);
  local_a8 = local_b8;
  local_a0 = local_b0;
  VVar13 = Normalize<float>((Vector3<float> *)
                            CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  local_c8.z = VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar10._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar10._8_56_ = auVar11;
  local_c8._0_8_ = vmovlpd_avx(auVar10._0_16_);
  v = in_RDI + 2;
  local_9c._0_8_ = local_c8._0_8_;
  local_9c.z = local_c8.z;
  local_cc = Dot<float>((Vector3<float> *)v,(Vector3<float> *)&local_9c);
  if (((uint)in_RDI[4].super_Tuple3<pbrt::Point3,_float>.z & 1) != 0) {
    std::abs((int)v);
  }
  vfmadd213ss_fma(ZEXT416((uint)local_cc),ZEXT416((uint)-local_cc),SUB6416(ZEXT464(0x3f800000),0));
  local_d0 = SafeSqrt(0.0);
  BoundSubtendedDirections
            ((Bounds3f *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff18);
  vfmadd213ss_fma(ZEXT416((uint)in_stack_ffffffffffffff20),ZEXT416((uint)-in_stack_ffffffffffffff20)
                  ,SUB6416(ZEXT464(0x3f800000),0));
  local_f0 = SafeSqrt(0.0);
  vfmadd213ss_fma(ZEXT416((uint)in_RDI[4].super_Tuple3<pbrt::Point3,_float>.x),
                  ZEXT416((uint)-in_RDI[4].super_Tuple3<pbrt::Point3,_float>.x),
                  SUB6416(ZEXT464(0x3f800000),0));
  fVar5 = local_cc;
  sinThetaA = local_d0;
  fVar4 = SafeSqrt(0.0);
  local_f4 = Importance::anon_class_1_0_00000001::operator()
                       (&local_d1,sinThetaA,fVar5,fVar4,
                        in_RDI[4].super_Tuple3<pbrt::Point3,_float>.x);
  vfmadd213ss_fma(ZEXT416((uint)in_RDI[4].super_Tuple3<pbrt::Point3,_float>.x),
                  ZEXT416((uint)-in_RDI[4].super_Tuple3<pbrt::Point3,_float>.x),
                  SUB6416(ZEXT464(0x3f800000),0));
  fVar4 = local_cc;
  sinThetaA_00 = local_d0;
  sinThetaB = SafeSqrt(0.0);
  local_f8 = Importance::anon_class_1_0_00000001::operator()
                       (&local_d2,sinThetaA_00,fVar4,sinThetaB,
                        in_RDI[4].super_Tuple3<pbrt::Point3,_float>.x);
  local_fc = Importance::anon_class_1_0_00000001::operator()
                       (&local_d1,local_f8,local_f4,local_f0,in_stack_ffffffffffffff20);
  if (in_RDI[4].super_Tuple3<pbrt::Point3,_float>.y < local_fc) {
    local_100 = (in_RDI[3].super_Tuple3<pbrt::Point3,_float>.x * local_fc) / local_6c;
    Normal3<float>::Normal3((Normal3<float> *)CONCAT44(sinThetaA_00,fVar4),sinThetaA,fVar5,0.0);
    bVar1 = Tuple3<pbrt::Normal3,_float>::operator!=
                      (&local_30,(Normal3<float> *)&stack0xfffffffffffffef4);
    if (bVar1) {
      cosThetaA = AbsDot<float>((Vector3<float> *)CONCAT44(sinThetaA_00,fVar4),
                                (Normal3<float> *)CONCAT44(sinThetaA,fVar5));
      vfmadd213ss_fma(ZEXT416((uint)cosThetaA),ZEXT416((uint)-cosThetaA),
                      SUB6416(ZEXT464(0x3f800000),0));
      fVar5 = SafeSqrt(0.0);
      FVar6 = Importance::anon_class_1_0_00000001::operator()
                        (&local_d1,fVar5,cosThetaA,local_f0,in_stack_ffffffffffffff20);
      local_100 = FVar6 * local_100;
    }
    pfVar2 = std::max<float>(&local_100,(float *)&stack0xfffffffffffffee4);
    local_4 = *pfVar2;
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

PBRT_CPU_GPU
    Float Importance(Point3f p, Normal3f n) const {
        // Compute clamped squared distance to _intr_
        Point3f pc = Centroid();
        Float d2 = DistanceSquared(p, pc);
        // Don't let d2 get too small if p is inside the bounds.
        d2 = std::max(d2, Length(b.Diagonal()) / 2);

        Vector3f wi = Normalize(p - pc);

        Float cosTheta = Dot(w, wi);
        if (twoSided)
            cosTheta = std::abs(cosTheta);
#if 0
    else if (cosTheta < 0 && cosTheta_o == 1) {
        // Catch the case where the point is outside the bounds and definitely
        // not in the emitted cone even though the conservative theta_u test
        // make suggest it could be.
        // Doesn't seem to make much difference in practice.
        if ((p.x < b.pMin.x || p.x > b.pMax.x) &&
            (p.y < b.pMin.y || p.y > b.pMax.y) &&
            (p.z < b.pMin.z || p.z > b.pMax.z))
            return 0;
    }
#endif

        // FIXME? unstable when cosTheta \approx 1
        Float sinTheta = SafeSqrt(1 - cosTheta * cosTheta);

        // Define sine and cosine clamped subtraction lambdas
        // cos(max(0, a-b))
        auto cosSubClamped = [](Float sinThetaA, Float cosThetaA, Float sinThetaB,
                                Float cosThetaB) -> Float {
            if (cosThetaA > cosThetaB)
                // Handle the max(0, ...)
                return 1;
            return cosThetaA * cosThetaB + sinThetaA * sinThetaB;
        };
        // sin(max(0, a-b))
        auto sinSubClamped = [](Float sinThetaA, Float cosThetaA, Float sinThetaB,
                                Float cosThetaB) -> Float {
            if (cosThetaA > cosThetaB)
                // Handle the max(0, ...)
                return 0;
            return sinThetaA * cosThetaB - cosThetaA * sinThetaB;
        };

        // Compute $\cos \theta_\roman{u}$ for _intr_
        Float cosTheta_u = BoundSubtendedDirections(b, p).cosTheta;
        Float sinTheta_u = SafeSqrt(1 - cosTheta_u * cosTheta_u);

        // Compute $\cos \theta_\roman{p}$ for _intr_ and test against $\cos
        // \theta_\roman{e}$
        // cos(theta_p). Compute in two steps
        Float cosTheta_x = cosSubClamped(
            sinTheta, cosTheta, SafeSqrt(1 - cosTheta_o * cosTheta_o), cosTheta_o);
        Float sinTheta_x = sinSubClamped(
            sinTheta, cosTheta, SafeSqrt(1 - cosTheta_o * cosTheta_o), cosTheta_o);
        Float cosTheta_p = cosSubClamped(sinTheta_x, cosTheta_x, sinTheta_u, cosTheta_u);
        if (cosTheta_p <= cosTheta_e)
            return 0;

        Float imp = phi * cosTheta_p / d2;
        DCHECK_GE(imp, -1e-3);

        // Account for $\cos \theta_\roman{i}$ in importance at surfaces
        if (n != Normal3f(0, 0, 0)) {
            // cos(thetap_i) = cos(max(0, theta_i - theta_u))
            // cos (a-b) = cos a cos b + sin a sin b
            Float cosTheta_i = AbsDot(wi, n);
            Float sinTheta_i = SafeSqrt(1 - cosTheta_i * cosTheta_i);
            Float cosThetap_i =
                cosSubClamped(sinTheta_i, cosTheta_i, sinTheta_u, cosTheta_u);
            imp *= cosThetap_i;
        }

        return std::max<Float>(imp, 0);
    }